

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O1

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<bool,_std::allocator<bool>_> *variable,string *value)

{
  bool __x;
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)value);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)value);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)value);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)value);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)value);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)value);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)value);
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)value);
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare((char *)value);
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare((char *)value);
                    if (iVar1 != 0) {
                      __x = false;
                      goto LAB_0012fc14;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __x = true;
LAB_0012fc14:
  std::vector<bool,_std::allocator<bool>_>::push_back(variable,__x);
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(std::vector<bool>* variable,
                                            const std::string& value)
{
  bool val = false;
  if (value == "1" || value == "ON" || value == "on" || value == "On" ||
      value == "TRUE" || value == "true" || value == "True" ||
      value == "yes" || value == "Yes" || value == "YES") {
    val = true;
  }
  variable->push_back(val);
}